

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O1

void LD4_SSE2(uint8_t *dst)

{
  ulong uVar1;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 auVar2 [16];
  undefined1 uVar6;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined4 uVar7;
  undefined5 uVar8;
  undefined6 uVar9;
  
  uVar1 = *(ulong *)(dst + -0x20);
  auVar11._8_4_ = (int)uVar1;
  auVar11._0_8_ = uVar1;
  auVar11._12_4_ = (int)(uVar1 >> 0x20);
  uVar12 = (undefined1)(uVar1 >> 0x10);
  auVar10[0] = pavgb((char)uVar1,uVar12);
  uVar13 = (undefined1)(uVar1 >> 0x18);
  uVar6 = (undefined1)(uVar1 >> 8);
  auVar10[1] = pavgb(uVar6,uVar13);
  uVar14 = (undefined1)(uVar1 >> 0x20);
  auVar10[2] = pavgb(uVar12,uVar14);
  uVar3 = (undefined1)(uVar1 >> 0x28);
  auVar10[3] = pavgb(uVar13,uVar3);
  uVar4 = (undefined1)(uVar1 >> 0x30);
  auVar10[4] = pavgb(uVar14,uVar4);
  uVar5 = (undefined1)(uVar1 >> 0x38);
  auVar10[5] = pavgb(uVar3,uVar5);
  auVar10[6] = pavgb(uVar4,dst[-0x19]);
  auVar10[7] = pavgb(uVar5,0);
  auVar10[8] = pavgb(0,0);
  auVar10[9] = pavgb(0,0);
  auVar10[10] = pavgb(0,0);
  auVar10[0xb] = pavgb(0,0);
  auVar10[0xc] = pavgb(0,0);
  auVar10[0xd] = pavgb(0,0);
  auVar10[0xe] = pavgb(0,0);
  auVar10[0xf] = pavgb(0,0);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (auVar11._8_8_ >> 0x10 | (ulong)dst[-0x19] << 0x30) ^ uVar1;
  auVar11 = psubusb(auVar10,auVar2 & _DAT_001b8050);
  uVar6 = pavgb(auVar11[0],uVar6);
  uVar12 = pavgb(auVar11[1],uVar12);
  uVar13 = pavgb(auVar11[2],uVar13);
  uVar14 = pavgb(auVar11[3],uVar14);
  uVar7 = CONCAT13(uVar14,CONCAT12(uVar13,CONCAT11(uVar12,uVar6)));
  uVar12 = pavgb(auVar11[4],uVar3);
  uVar8 = CONCAT14(uVar12,uVar7);
  uVar12 = pavgb(auVar11[5],uVar4);
  uVar9 = CONCAT15(uVar12,uVar8);
  uVar12 = pavgb(auVar11[6],uVar5);
  pavgb(auVar11[7],0);
  pavgb(auVar11[8],0);
  pavgb(auVar11[9],0);
  pavgb(auVar11[10],0);
  pavgb(auVar11[0xb],0);
  pavgb(auVar11[0xc],0);
  pavgb(auVar11[0xd],0);
  pavgb(auVar11[0xe],0);
  pavgb(auVar11[0xf],0);
  *(undefined4 *)dst = uVar7;
  *(int *)(dst + 0x20) = (int)((uint5)uVar8 >> 8);
  *(int *)(dst + 0x40) = (int)((uint6)uVar9 >> 0x10);
  *(int *)(dst + 0x60) = (int)(CONCAT16(uVar12,uVar9) >> 0x18);
  return;
}

Assistant:

static void LD4_SSE2(uint8_t* dst) {   // Down-Left
  const __m128i one = _mm_set1_epi8(1);
  const __m128i ABCDEFGH = _mm_loadl_epi64((__m128i*)(dst - BPS));
  const __m128i BCDEFGH0 = _mm_srli_si128(ABCDEFGH, 1);
  const __m128i CDEFGH00 = _mm_srli_si128(ABCDEFGH, 2);
  const __m128i CDEFGHH0 = _mm_insert_epi16(CDEFGH00, dst[-BPS + 7], 3);
  const __m128i avg1 = _mm_avg_epu8(ABCDEFGH, CDEFGHH0);
  const __m128i lsb = _mm_and_si128(_mm_xor_si128(ABCDEFGH, CDEFGHH0), one);
  const __m128i avg2 = _mm_subs_epu8(avg1, lsb);
  const __m128i abcdefg = _mm_avg_epu8(avg2, BCDEFGH0);
  WebPInt32ToMem(dst + 0 * BPS, _mm_cvtsi128_si32(               abcdefg    ));
  WebPInt32ToMem(dst + 1 * BPS, _mm_cvtsi128_si32(_mm_srli_si128(abcdefg, 1)));
  WebPInt32ToMem(dst + 2 * BPS, _mm_cvtsi128_si32(_mm_srli_si128(abcdefg, 2)));
  WebPInt32ToMem(dst + 3 * BPS, _mm_cvtsi128_si32(_mm_srli_si128(abcdefg, 3)));
}